

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_filtering.cpp
# Opt level: O0

pair<double,_double>
anon_unknown.dwarf_cabf2::FilterFunctionTest(filterFunction Filter,uint32_t size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined4 in_ESI;
  code *in_RDI;
  uint32_t i;
  Image output;
  Image input;
  TimerContainer timer;
  TimerContainer *in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar4;
  uint32_t in_stack_ffffffffffffff34;
  uint uVar5;
  uint uVar6;
  uint32_t in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  BaseTimerContainer *in_stack_ffffffffffffff70;
  ImageTemplate<unsigned_char> local_68;
  undefined4 local_1c;
  code *local_18;
  pair<double,_double> local_10;
  
  local_1c = in_ESI;
  local_18 = in_RDI;
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff10);
  Test_Helper::randomValue<unsigned_char>
            ((uchar)((ulong)in_stack_ffffffffffffff10 >> 0x30),(uint32_t)in_stack_ffffffffffffff10);
  uVar4 = local_1c;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c
             ,in_stack_ffffffffffffff18,(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             (Image *)CONCAT44(uVar4,local_1c));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x16ee3d);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_68);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_68);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar1,uVar2),in_stack_ffffffffffffff1c,
             in_stack_ffffffffffffff18,(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x30));
  uVar5 = 0;
  while( true ) {
    uVar6 = uVar5;
    uVar3 = Test_Helper::runCount();
    if (uVar3 <= uVar5) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff10);
    (*local_18)(&local_68,&stack0xffffffffffffff38);
    Performance_Test::TimerContainer::stop((TimerContainer *)CONCAT44(uVar1,uVar2));
    uVar5 = uVar6 + 1;
  }
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff70);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x16efa7);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x16efb4);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x16efc1);
  return local_10;
}

Assistant:

std::pair < double, double > FilterFunctionTest( filterFunction Filter, uint32_t size )
    {
        Performance_Test::TimerContainer timer;

        PenguinV_Image::Image input = Performance_Test::uniformImage( Performance_Test::randomValue<uint8_t>( 1, 256 ), size, size );
        PenguinV_Image::Image output( input.width(), input.height() );

        for( uint32_t i = 0; i < Performance_Test::runCount(); ++i ) {
            timer.start();

            Filter( input, output );

            timer.stop();
        }

        return timer.mean();
    }